

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

char * __thiscall cmMakefile::GetProperty(cmMakefile *this,string *prop)

{
  bool bVar1;
  int iVar2;
  _Base_ptr p_Var3;
  _Alloc_hider _Var4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  cmStateDirectory local_48;
  
  if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
    if (iVar2 != 0) {
      GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2;
      GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0;
      GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
    }
  }
  bVar1 = std::operator==(prop,"TESTS");
  if (bVar1) {
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (p_Var3 = (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->Tests)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      std::__cxx11::string::string((string *)&local_48,(string *)(p_Var3 + 1));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)&local_48,&local_68,";");
    std::__cxx11::string::operator=
              ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
               (string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    _Var4 = GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
  }
  else {
    cmStateSnapshot::GetDirectory(&local_48,&this->StateSnapshot);
    _Var4._M_p = cmStateDirectory::GetProperty(&local_48,prop);
  }
  return _Var4._M_p;
}

Assistant:

const char* cmMakefile::GetProperty(const std::string& prop) const
{
  // Check for computed properties.
  static std::string output;
  if (prop == "TESTS") {
    std::vector<std::string> keys;
    // get list of keys
    std::transform(this->Tests.begin(), this->Tests.end(),
                   std::back_inserter(keys),
                   [](decltype(this->Tests)::value_type const& pair) {
                     return pair.first;
                   });
    output = cmJoin(keys, ";");
    return output.c_str();
  }

  return this->StateSnapshot.GetDirectory().GetProperty(prop);
}